

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int GetSectorSize(unqlite_file *pFd)

{
  undefined4 local_14;
  int iSectorSize;
  unqlite_file *pFd_local;
  
  local_14 = 0x200;
  if (pFd != (unqlite_file *)0x0) {
    local_14 = unqliteOsSectorSize(pFd);
    if (local_14 < 0x20) {
      local_14 = 0x200;
    }
    if (0x10000 < local_14) {
      local_14 = 0x10000;
    }
  }
  return local_14;
}

Assistant:

static int GetSectorSize(unqlite_file *pFd)
{
	int iSectorSize = UNQLITE_DEFAULT_SECTOR_SIZE;
	if( pFd ){
		iSectorSize = unqliteOsSectorSize(pFd);
		if( iSectorSize < 32 ){
			iSectorSize = 512;
		}
		if( iSectorSize > MAX_SECTOR_SIZE ){
			iSectorSize = MAX_SECTOR_SIZE;
		}
	}
	return iSectorSize;
}